

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * soul::Value::createUnsizedArray(Value *__return_storage_ptr__,Type *elementType,Handle h)

{
  PackedData PStack_48;
  Type local_30;
  
  if ((elementType->category == array) && (elementType->boundingSize == 0)) {
    throwInternalCompilerError("! elementType.isUnsizedArray()","createUnsizedArray",0x1ee);
  }
  Type::createArray(&local_30,elementType,0);
  Value(__return_storage_ptr__,&local_30);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_30.structure.object);
  getData(&PStack_48,__return_storage_ptr__);
  if (PStack_48.size == 8) {
    *(Handle *)PStack_48.data = h;
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","setAs",0x161);
}

Assistant:

Value Value::createUnsizedArray (const Type& elementType, ConstantTable::Handle h)
{
    SOUL_ASSERT (! elementType.isUnsizedArray());  // this may need to be removed at some point, but is here as a useful sanity-check
    Value v (elementType.createUnsizedArray());
    v.getData().setAs (h);
    return v;
}